

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viterbi.c
# Opt level: O0

int32 mmi_viterbi_update(vector_t **feature,uint32 n_obs,state_t *state_seq,uint32 n_state,
                        model_inventory_t *inv,float64 a_beam,int32 mean_reest,int32 var_reest,
                        float64 arc_gamma,feat_t *fcb)

{
  uint n_feat_00;
  uint uVar1;
  uint n_top_00;
  uint n_lcl;
  uint uVar2;
  gauden_t *g_00;
  float32 ***pppfVar3;
  uint32 *lcl2gbl;
  float64 *scale_00;
  float64 **dscale_00;
  uint32 *n_active_astate_00;
  float64 **active_alpha_00;
  uint32 **active_astate_00;
  uint32 *cb;
  uint32 **bp_00;
  cmd_ln_t *cmdln;
  char *pcVar4;
  float64 op_00;
  uint32 prev;
  float64 p_reest_term;
  float64 op;
  uint32 l_ci_cb;
  uint32 l_cb;
  uint32 n_cb;
  int ret;
  uint32 n_top;
  uint32 n_density;
  uint32 n_feat;
  int32 t;
  uint32 q;
  uint32 j;
  uint32 i;
  uint32 *cb_inv;
  size_t sStack_d0;
  uint32 n_lcl_cb;
  size_t denacc_size;
  float32 ***denacc;
  uint32 n_active_cb;
  uint32 *active_cb;
  uint32 ***now_den_idx;
  float64 ***now_den;
  float32 ***mixw;
  gauden_t *g;
  uint32 *n_active_astate;
  uint32 **bp;
  uint32 **active_astate;
  float64 **active_alpha;
  float64 **dscale;
  float64 *scale;
  float64 arc_gamma_local;
  int32 mean_reest_local;
  float64 a_beam_local;
  model_inventory_t *inv_local;
  uint32 n_state_local;
  state_t *state_seq_local;
  uint32 n_obs_local;
  vector_t **feature_local;
  
  now_den_idx = (uint32 ***)0x0;
  active_cb = (uint32 *)0x0;
  denacc_size = 0;
  if (n_obs == 0) {
    __assert_fail("n_obs > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                  ,0x349,
                  "int32 mmi_viterbi_update(vector_t **, uint32, state_t *, uint32, model_inventory_t *, float64, int32, int32, float64, feat_t *)"
                 );
  }
  if (n_state == 0) {
    __assert_fail("n_state > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                  ,0x34a,
                  "int32 mmi_viterbi_update(vector_t **, uint32, state_t *, uint32, model_inventory_t *, float64, int32, int32, float64, feat_t *)"
                 );
  }
  g_00 = inv->gauden;
  n_feat_00 = g_00->n_feat;
  uVar1 = g_00->n_density;
  n_top_00 = g_00->n_top;
  if (mmi_viterbi_update::p_op == (float64 *)0x0) {
    mmi_viterbi_update::p_op =
         (float64 *)
         __ckd_calloc__((ulong)n_feat_00,8,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                        ,0x353);
    mmi_viterbi_update::p_ci_op =
         (float64 *)
         __ckd_calloc__((ulong)n_feat_00,8,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                        ,0x354);
  }
  if (mmi_viterbi_update::d_term == (float64 **)0x0) {
    mmi_viterbi_update::d_term =
         (float64 **)
         __ckd_calloc_2d__((ulong)n_feat_00,(ulong)n_top_00,8,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                           ,0x358);
    mmi_viterbi_update::d_term_ci =
         (float64 **)
         __ckd_calloc_2d__((ulong)n_feat_00,(ulong)n_top_00,8,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                           ,0x359);
  }
  scale_00 = (float64 *)
             __ckd_calloc__((ulong)n_obs,8,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                            ,0x35c);
  dscale_00 = (float64 **)
              __ckd_calloc__((ulong)n_obs,8,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                             ,0x35d);
  n_active_astate_00 =
       (uint32 *)
       __ckd_calloc__((ulong)n_obs,4,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                      ,0x35e);
  active_alpha_00 =
       (float64 **)
       __ckd_calloc__((ulong)n_obs,8,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                      ,0x35f);
  active_astate_00 =
       (uint32 **)
       __ckd_calloc__((ulong)n_obs,8,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                      ,0x360);
  cb = (uint32 *)
       __ckd_calloc__((ulong)(n_state << 1),4,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                      ,0x361);
  bp_00 = (uint32 **)
          __ckd_calloc__((ulong)n_obs,8,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                         ,0x362);
  l_cb = forward(active_alpha_00,active_astate_00,n_active_astate_00,bp_00,scale_00,dscale_00,
                 feature,n_obs,state_seq,n_state,inv,a_beam,(s3phseg_t *)0x0,(bw_timers_t *)0x0,1);
  cmdln = cmd_ln_get();
  pcVar4 = cmd_ln_str_r(cmdln,"-outphsegdir");
  if (pcVar4 != (char *)0x0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
            ,0x36b,"current MMI implementation don\'t support -outphsegdir\n");
    exit(1);
  }
  if (l_cb == 0) {
    pppfVar3 = inv->mixw;
    n_lcl = inv->n_cb_inverse;
    lcl2gbl = inv->cb_inverse;
    gauden_alloc_l_acc(g_00,n_lcl,mean_reest,var_reest,0);
    now_den_idx = (uint32 ***)
                  __ckd_calloc_3d__((ulong)n_lcl,(ulong)n_feat_00,(ulong)n_top_00,8,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                                    ,0x386);
    active_cb = (uint32 *)
                __ckd_calloc_3d__((ulong)n_lcl,(ulong)n_feat_00,(ulong)n_top_00,4,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                                  ,0x38a);
    if ((mean_reest == 0) && (var_reest == 0)) {
      denacc_size = 0;
      sStack_d0 = 0;
    }
    else {
      denacc_size = (size_t)__ckd_calloc_3d__((ulong)n_lcl,(ulong)n_feat_00,(ulong)uVar1,4,
                                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                                              ,0x391);
      sStack_d0 = (ulong)(n_lcl * n_feat_00 * uVar1) << 2;
    }
    for (n_feat = 0;
        (n_feat < n_active_astate_00[n_obs - 1] &&
        (active_astate_00[n_obs - 1][n_feat] != n_state - 1)); n_feat = n_feat + 1) {
    }
    if (n_feat == n_active_astate_00[n_obs - 1]) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
              ,0x3a2,
              "Failed to align audio to trancript: final state of the search is not reached\n");
      l_cb = 0xffffffff;
    }
    else {
      for (n_density = n_obs - 1; -1 < (int)n_density; n_density = n_density - 1) {
        t = active_astate_00[(int)n_density][n_feat];
        while (state_seq[(uint)t].mixw == 0xffffffff) {
          t = active_astate_00[(int)n_density][bp_00[(int)n_density][n_feat]];
          n_feat = bp_00[(int)n_density][n_feat];
        }
        uVar1 = state_seq[(uint)t].l_cb;
        uVar2 = state_seq[(uint)t].l_ci_cb;
        gauden_compute_log(((float64 ***)now_den_idx)[uVar1],
                           *(uint32 ***)((long)active_cb + (ulong)uVar1 * 8),feature[(int)n_density]
                           ,g_00,state_seq[(uint)t].cb,(uint32 **)0x0);
        denacc._4_4_ = 1;
        *cb = uVar1;
        if (uVar1 != uVar2) {
          gauden_compute_log(((float64 ***)now_den_idx)[uVar2],
                             *(uint32 ***)((long)active_cb + (ulong)uVar2 * 8),
                             feature[(int)n_density],g_00,state_seq[(uint)t].ci_cb,(uint32 **)0x0);
          denacc._4_4_ = 2;
          cb[1] = uVar2;
        }
        l_cb = gauden_scale_densities_bwd
                         ((float64 ***)now_den_idx,(uint32 ***)active_cb,dscale_00 + (int)n_density,
                          cb,denacc._4_4_,g_00);
        if (l_cb != 0) goto LAB_00112cd1;
        if (state_seq[(uint)t].mixw == 0xffffffff) {
          __assert_fail("state_seq[j].mixw != TYING_NON_EMITTING",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
                        ,0x3d2,
                        "int32 mmi_viterbi_update(vector_t **, uint32, state_t *, uint32, model_inventory_t *, float64, int32, int32, float64, feat_t *)"
                       );
        }
        op_00 = gauden_mixture(((float64 ***)now_den_idx)[uVar1],
                               *(uint32 ***)((long)active_cb + (ulong)uVar1 * 8),
                               pppfVar3[state_seq[(uint)t].mixw],g_00);
        partial_op(mmi_viterbi_update::p_op,op_00,((float64 ***)now_den_idx)[uVar1],
                   *(uint32 ***)((long)active_cb + (ulong)uVar1 * 8),
                   pppfVar3[state_seq[(uint)t].mixw],n_feat_00,n_top_00);
        den_terms(mmi_viterbi_update::d_term,(float64)(1.0 / (double)op_00),mmi_viterbi_update::p_op
                  ,((float64 ***)now_den_idx)[uVar1],
                  *(uint32 ***)((long)active_cb + (ulong)uVar1 * 8),
                  pppfVar3[state_seq[(uint)t].mixw],n_feat_00,n_top_00);
        if (uVar1 != uVar2) {
          partial_ci_op(mmi_viterbi_update::p_ci_op,((float64 ***)now_den_idx)[uVar2],
                        *(uint32 ***)((long)active_cb + (ulong)uVar2 * 8),
                        pppfVar3[state_seq[(uint)t].ci_mixw],n_feat_00,n_top_00);
          den_terms_ci(mmi_viterbi_update::d_term_ci,1.0,mmi_viterbi_update::p_ci_op,
                       ((float64 ***)now_den_idx)[uVar2],
                       *(uint32 ***)((long)active_cb + (ulong)uVar2 * 8),
                       pppfVar3[state_seq[(uint)t].ci_mixw],n_feat_00,n_top_00);
        }
        if (((mean_reest != 0) || (var_reest != 0)) &&
           (accum_den_terms(*(float32 ***)(denacc_size + (ulong)uVar1 * 8),
                            mmi_viterbi_update::d_term,
                            *(uint32 ***)((long)active_cb + (ulong)uVar1 * 8),n_feat_00,n_top_00),
           uVar1 != uVar2)) {
          accum_den_terms(*(float32 ***)(denacc_size + (ulong)uVar2 * 8),
                          mmi_viterbi_update::d_term_ci,
                          *(uint32 ***)((long)active_cb + (ulong)uVar2 * 8),n_feat_00,n_top_00);
        }
        if ((mean_reest != 0) || (var_reest != 0)) {
          mmi_accum_gauden((float32 ***)denacc_size,lcl2gbl,n_lcl,feature[(int)n_density],
                           (uint32 ***)active_cb,g_00,mean_reest,var_reest,arc_gamma,fcb);
          memset((void *)**(undefined8 **)denacc_size,0,sStack_d0);
        }
        if (0 < (int)n_density) {
          n_feat = bp_00[(int)n_density][n_feat];
        }
      }
      accum_global(inv,state_seq,n_state,0,0,mean_reest,var_reest,0);
    }
  }
LAB_00112cd1:
  ckd_free(scale_00);
  for (q = 0; q < n_obs; q = q + 1) {
    if (dscale_00[q] != (float64 *)0x0) {
      ckd_free(dscale_00[q]);
    }
  }
  ckd_free(dscale_00);
  ckd_free(n_active_astate_00);
  for (q = 0; q < n_obs; q = q + 1) {
    ckd_free(active_alpha_00[q]);
    ckd_free(active_astate_00[q]);
    ckd_free(bp_00[q]);
  }
  ckd_free(active_alpha_00);
  ckd_free(active_astate_00);
  ckd_free(cb);
  ckd_free(bp_00);
  if (denacc_size != 0) {
    ckd_free_3d((void *)denacc_size);
  }
  if (now_den_idx != (uint32 ***)0x0) {
    ckd_free_3d(now_den_idx);
  }
  if (active_cb != (uint32 *)0x0) {
    ckd_free_3d(active_cb);
  }
  if (l_cb != 0) {
    pcVar4 = corpus_utt_brief_name();
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/bw/viterbi.c"
            ,0x44d,"viterbi update error in sentence %s\n",pcVar4);
  }
  return l_cb;
}

Assistant:

int32
mmi_viterbi_update(vector_t **feature,
		   uint32 n_obs,
		   state_t *state_seq,
		   uint32 n_state,
		   model_inventory_t *inv,
		   float64 a_beam,
		   int32 mean_reest,
		   int32 var_reest,
		   float64 arc_gamma,
		   feat_t *fcb)
{
    float64 *scale = NULL;
    float64 **dscale = NULL;
    float64 **active_alpha;
    uint32 **active_astate;
    uint32 **bp;
    uint32 *n_active_astate;
    gauden_t *g;/* Gaussian density parameters and reestimation sums */
    float32 ***mixw;/* all mixing weights */
    float64 ***now_den = NULL;/* Short for den[t] */
    uint32 ***now_den_idx = NULL;/* Short for den_idx[t] */
    uint32 *active_cb;
    uint32 n_active_cb;
    float32 ***denacc = NULL;/* mean/var reestimation accumulators for time t */
    size_t denacc_size;/* Total size of data references in denacc.  Allows
			  for quick clears between time frames */
    uint32 n_lcl_cb;
    uint32 *cb_inv;
    uint32 i, j, q;
    int32 t;
    uint32 n_feat;
    uint32 n_density;
    uint32 n_top;
    int ret;
    uint32 n_cb;

    static float64 *p_op = NULL;
    static float64 *p_ci_op = NULL;
    static float64 **d_term = NULL;
    static float64 **d_term_ci = NULL;

    /* caller must ensure that there is some non-zero amount
       of work to be done here */
    assert(n_obs > 0);
    assert(n_state > 0);

    g = inv->gauden;
    n_feat = gauden_n_feat(g);
    n_density = gauden_n_density(g);
    n_top = gauden_n_top(g);
    n_cb = gauden_n_mgau(g);

    if (p_op == NULL) {
	p_op    = ckd_calloc(n_feat, sizeof(float64));
	p_ci_op = ckd_calloc(n_feat, sizeof(float64));
    }

    if (d_term == NULL) {
	d_term    = (float64 **)ckd_calloc_2d(n_feat, n_top, sizeof(float64));
	d_term_ci = (float64 **)ckd_calloc_2d(n_feat, n_top, sizeof(float64));
    }

    scale = (float64 *)ckd_calloc(n_obs, sizeof(float64));
    dscale = (float64 **)ckd_calloc(n_obs, sizeof(float64 *));
    n_active_astate = (uint32 *)ckd_calloc(n_obs, sizeof(uint32));
    active_alpha  = (float64 **)ckd_calloc(n_obs, sizeof(float64 *));
    active_astate = (uint32 **)ckd_calloc(n_obs, sizeof(uint32 *));
    active_cb = ckd_calloc(2*n_state, sizeof(uint32));
    bp = (uint32 **)ckd_calloc(n_obs, sizeof(uint32 *));

    /* Run forward algorithm, which has embedded Viterbi. */
    ret = forward(active_alpha, active_astate, n_active_astate, bp,
		  scale, dscale,
		  feature, n_obs, state_seq, n_state,
		  inv, a_beam, NULL, NULL, 1);
    
    if (cmd_ln_str("-outphsegdir")) {
	E_FATAL("current MMI implementation don't support -outphsegdir\n");
    }


    if (ret != S3_SUCCESS) {

	/* Some problem with the utterance, release per utterance storage and
	 * forget about adding the utterance accumulators to the global accumulators */

	goto all_done;
    }

    mixw = inv->mixw;

    n_lcl_cb = inv->n_cb_inverse;
    cb_inv = inv->cb_inverse;

    /* Allocate local accumulators for mean, variance reestimation
       sums if necessary */
    gauden_alloc_l_acc(g, n_lcl_cb,
		       mean_reest, var_reest,
		       FALSE);

    n_active_cb = 0;
    now_den = (float64 ***)ckd_calloc_3d(n_lcl_cb,
					 n_feat,
					 n_top,
					 sizeof(float64));
    now_den_idx =  (uint32 ***)ckd_calloc_3d(n_lcl_cb,
					     n_feat,
					     n_top,
					     sizeof(uint32));

    if (mean_reest || var_reest) {
	/* allocate space for the per frame density counts */
	denacc = (float32 ***)ckd_calloc_3d(n_lcl_cb,
					    n_feat,
					    n_density,
					    sizeof(float32));

	/* # of bytes required to store all weighted vectors */
	denacc_size = n_lcl_cb * n_feat * n_density * sizeof(float32);
    }
    else {
	denacc = NULL;
	denacc_size = 0;
    }

    /* Okay now run through the backtrace and accumulate counts. */
    /* Find the non-emitting ending state */
    for (q = 0; q < n_active_astate[n_obs-1]; ++q) {
	if (active_astate[n_obs-1][q] == n_state-1)
	    break;
    }
    if (q == n_active_astate[n_obs-1]) {
	E_ERROR("Failed to align audio to trancript: final state of the search is not reached\n");
	ret = S3_ERROR;
	goto all_done;
    }

    for (t = n_obs-1; t >= 0; --t) {
	uint32 l_cb;
	uint32 l_ci_cb;
	float64 op, p_reest_term;
	uint32 prev;

	j = active_astate[t][q];

	/* Follow any non-emitting states at time t first. */
	while (state_seq[j].mixw == TYING_NON_EMITTING) {
	    prev = active_astate[t][bp[t][q]];
	    q = bp[t][q];
	    j = prev;
	}

	/* Now accumulate statistics for the real state. */
	l_cb = state_seq[j].l_cb;
	l_ci_cb = state_seq[j].l_ci_cb;
	n_active_cb = 0;

	gauden_compute_log(now_den[l_cb],
			   now_den_idx[l_cb],
			   feature[t],
			   g,
			   state_seq[j].cb,
			   NULL);
	active_cb[n_active_cb++] = l_cb;

	if (l_cb != l_ci_cb) {
	    gauden_compute_log(now_den[l_ci_cb],
			       now_den_idx[l_ci_cb],
			       feature[t],
			       g,
			       state_seq[j].ci_cb,
			       NULL);
	    active_cb[n_active_cb++] = l_ci_cb;
	}
	ret = gauden_scale_densities_bwd(now_den, now_den_idx,
					 &dscale[t],
					 active_cb, n_active_cb, g);
	if (ret != S3_SUCCESS)
	    goto all_done;
	
	assert(state_seq[j].mixw != TYING_NON_EMITTING);
	/* Now calculate mixture densities. */
	/* This is the normalizer sum_m c_{jm} p(o_t|\lambda_{jm}) */
	op = gauden_mixture(now_den[l_cb], now_den_idx[l_cb],
			    mixw[state_seq[j].mixw], g);

	/* Make up this bogus value to be consistent with backward.c */
	p_reest_term = 1.0 / op;

	/* Compute the output probability excluding the contribution
	 * of each feature stream.  i.e. p_op[0] is the output
	 * probability excluding feature stream 0 */
	partial_op(p_op,
		   op,
		   now_den[l_cb],
		   now_den_idx[l_cb],
		   mixw[state_seq[j].mixw],
		   n_feat,
		   n_top);

	/* compute the probability of each (of possibly topn) density */
	den_terms(d_term,
		  p_reest_term,
		  p_op,
		  now_den[l_cb],
		  now_den_idx[l_cb],
		  mixw[state_seq[j].mixw],
		  n_feat,
		  n_top);

	if (l_cb != l_ci_cb) {
	    /* For each feature stream f, compute:
	     *     sum_k(mixw[f][k] den[f][k])
	     * and store the results in p_ci_op */
	    partial_ci_op(p_ci_op,
			  now_den[l_ci_cb],
			  now_den_idx[l_ci_cb],
			  mixw[state_seq[j].ci_mixw],
			  n_feat,
			  n_top);

	    /* For each feature stream and density compute the terms:
	     *   w[f][k] den[f][k] / sum_k(w[f][k] den[f][k]) * post_j
	     * and store results in d_term_ci */
	    den_terms_ci(d_term_ci,
			 1.0, /* post_j = 1.0 */
			 p_ci_op,
			 now_den[l_ci_cb],
			 now_den_idx[l_ci_cb],
			 mixw[state_seq[j].ci_mixw],
			 n_feat,
			 n_top);
	}
	    
	/* accumulate the probability for each density in the 
	 * density reestimation accumulators */
	if (mean_reest || var_reest) {
	    accum_den_terms(denacc[l_cb], d_term,
			    now_den_idx[l_cb], n_feat, n_top);
	    if (l_cb != l_ci_cb) {
		accum_den_terms(denacc[l_ci_cb], d_term_ci,
				now_den_idx[l_ci_cb], n_feat, n_top);
	    }
	}
	
	/* Note that there is only one state/frame so this is kind of
	   redundant */
	if (mean_reest || var_reest) {
	    /* Update the mean and variance reestimation accumulators */
	    mmi_accum_gauden(denacc,
			     cb_inv,
			     n_lcl_cb,
			     feature[t],
			     now_den_idx,
			     g,
			     mean_reest,
			     var_reest,
			     arc_gamma,
			     fcb);
	    memset(&denacc[0][0][0], 0, denacc_size);
	}
	
	if (t > 0) { 
	    prev = active_astate[t-1][bp[t][q]];
	    q = bp[t][q];
	    j = prev;
	}
    }

    /* If no error was found, add the resulting utterance reestimation
     * accumulators to the global reestimation accumulators */
    accum_global(inv, state_seq, n_state,
		 FALSE, FALSE, mean_reest, var_reest,
		 FALSE);

 all_done:
    ckd_free((void *)scale);
    for (i = 0; i < n_obs; i++) {
	if (dscale[i])
	    ckd_free((void *)dscale[i]);
    }
    ckd_free((void **)dscale);
    
    ckd_free(n_active_astate);
    for (i = 0; i < n_obs; i++) {
	ckd_free((void *)active_alpha[i]);
	ckd_free((void *)active_astate[i]);
	ckd_free((void *)bp[i]);
    }
    ckd_free((void *)active_alpha);
    ckd_free((void *)active_astate);
    ckd_free((void *)active_cb);
    ckd_free((void **)bp);

    if (denacc)
	ckd_free_3d((void ***)denacc);

    if (now_den)
	ckd_free_3d((void ***)now_den);
    if (now_den_idx)
	ckd_free_3d((void ***)now_den_idx);

    if (ret != S3_SUCCESS)
	E_ERROR("viterbi update error in sentence %s\n", corpus_utt_brief_name());

    return ret;
}